

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O1

parser_error parse_player_timed_name(parser *p)

{
  errr eVar1;
  parser_error pVar2;
  undefined8 in_RAX;
  undefined8 *puVar3;
  char *what;
  wchar_t index;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  puVar3 = (undefined8 *)parser_priv(p);
  what = parser_getstr(p,"name");
  eVar1 = grab_name("timed effect",what,list_timed_effect_names,0x36,&local_14);
  pVar2 = PARSE_ERROR_INVALID_SPELL_NAME;
  if (eVar1 == 0) {
    if (puVar3 == (undefined8 *)0x0) {
      __assert_fail("ps",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                    ,0x6a,"enum parser_error parse_player_timed_name(struct parser *)");
    }
    *puVar3 = timed_effects + local_14;
    puVar3[1] = 0;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_player_timed_name(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	const char *name = parser_getstr(p, "name");
	int index;

	if (grab_name("timed effect",
			name,
			list_timed_effect_names,
			N_ELEMENTS(list_timed_effect_names),
			&index)) {
		/* XXX not a desctiptive error */
		return PARSE_ERROR_INVALID_SPELL_NAME;
	}

	assert(ps);
	ps->t = &timed_effects[index];
	ps->e = NULL;

	return PARSE_ERROR_NONE;
}